

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_scanner.cpp
# Opt level: O2

void __thiscall
duckdb::SkipScanner::SkipScanner
          (SkipScanner *this,shared_ptr<duckdb::CSVBufferManager,_true> *buffer_manager,
          shared_ptr<duckdb::CSVStateMachine,_true> *state_machine,
          shared_ptr<duckdb::CSVErrorHandler,_true> *error_handler,idx_t rows_to_skip)

{
  type state_machine_00;
  shared_ptr<duckdb::CSVFileScan,_true> local_b8;
  __shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2> local_a8;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_98;
  shared_ptr<duckdb::CSVBufferManager,_true> local_88;
  CSVIterator local_78;
  
  local_88.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (buffer_manager->internal).
         super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (buffer_manager->internal).
       super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (buffer_manager->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (buffer_manager->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8,
             (__shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2> *)state_machine);
  local_98.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (error_handler->internal).
       super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (error_handler->internal).
       super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (error_handler->internal).super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (error_handler->internal).super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CSVIterator::CSVIterator(&local_78);
  BaseScanner::BaseScanner
            (&this->super_BaseScanner,&local_88,
             (shared_ptr<duckdb::CSVStateMachine,_true> *)&local_a8,&local_98,false,&local_b8,
             &local_78);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.internal.
              super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.internal.
              super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_BaseScanner)._vptr_BaseScanner = (_func_int **)&PTR__BaseScanner_027af118;
  state_machine_00 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*(state_machine);
  SkipResult::SkipResult
            (&this->result,&(this->super_BaseScanner).states,state_machine_00,rows_to_skip);
  return;
}

Assistant:

SkipScanner::SkipScanner(shared_ptr<CSVBufferManager> buffer_manager, const shared_ptr<CSVStateMachine> &state_machine,
                         shared_ptr<CSVErrorHandler> error_handler, idx_t rows_to_skip)
    : BaseScanner(std::move(buffer_manager), state_machine, std::move(error_handler)),
      result(states, *state_machine, rows_to_skip) {
}